

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O2

void uhash_removeAll_63(UHashtable *hash)

{
  UHashElement *e;
  int32_t pos;
  int32_t local_14;
  
  if (hash->count != 0) {
    while( true ) {
      e = uhash_nextElement_63(hash,&local_14);
      if (e == (UHashElement *)0x0) break;
      uhash_removeElement_63(hash,e);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_removeAll(UHashtable *hash) {
    int32_t pos = UHASH_FIRST;
    const UHashElement *e;
    U_ASSERT(hash != NULL);
    if (hash->count != 0) {
        while ((e = uhash_nextElement(hash, &pos)) != NULL) {
            uhash_removeElement(hash, e);
        }
    }
    U_ASSERT(hash->count == 0);
}